

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID ImGui::DockSpace(ImGuiID id,ImVec2 *size_arg,ImGuiDockNodeFlags flags,
                        ImGuiWindowClass *window_class)

{
  ImGuiWindow *this;
  ImGuiWindow_conflict *host_window;
  ImVec2 IVar1;
  undefined8 uVar2;
  ImGuiContext_conflict1 *ctx;
  ImGuiContext_conflict1 *pIVar3;
  bool bVar4;
  uint uVar5;
  ImGuiID IVar6;
  ImGuiID IVar7;
  ImGuiContext_conflict1 *g_1;
  ImGuiDockNode *node;
  ImGuiContext_conflict1 *g;
  uint uVar8;
  int iVar9;
  int iVar10;
  ImVec2 size;
  char title [256];
  
  ctx = GImGui;
  this = (ImGuiWindow *)GImGui->CurrentWindow;
  this->WriteAccessed = true;
  IVar7 = 0;
  if (((ctx->IO).ConfigFlags & 0x40) != 0) {
    if (((uint)flags >> 10 & 1) != 0) {
      __assert_fail("(flags & ImGuiDockNodeFlags_DockSpace) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x3bf0,
                    "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    if (id == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x3bf1,
                    "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    uVar8 = (uint)this->SkipItems | flags;
    node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,id);
    if (node == (ImGuiDockNode *)0x0) {
      node = DockContextAddNode(ctx,id);
      node->LocalFlags = 0x800;
      node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | 0x800;
    }
    node->SharedFlags = uVar8;
    if (window_class == (ImGuiWindowClass *)0x0) {
      title[0x10] = '\0';
      title[0x11] = '\0';
      title[0x12] = '\0';
      title[0x13] = '\0';
      title[0x14] = '\0';
      title[0x15] = '\0';
      title[0x16] = '\0';
      title[0x17] = '\0';
      title[0x18] = '\0';
      title[0] = '\0';
      title[1] = '\0';
      title[2] = '\0';
      title[3] = '\0';
      title[4] = '\0';
      title[5] = '\0';
      title[6] = '\0';
      title[7] = '\0';
      title[8] = '\0';
      title[9] = '\0';
      title[10] = '\0';
      title[0xb] = '\0';
      title[0xc] = '\0';
      title[0xd] = '\0';
      title[0xe] = '\0';
      title[0xf] = '\0';
      bVar4 = true;
    }
    else {
      title._0_8_ = *(undefined8 *)window_class;
      uVar2._0_4_ = window_class->ViewportFlagsOverrideSet;
      uVar2._4_4_ = window_class->ViewportFlagsOverrideClear;
      title._17_8_ = *(undefined8 *)((long)&window_class->TabItemFlagsOverrideSet + 1);
      title[0x10] = (char)((ulong)*(undefined8 *)((long)&window_class->ViewportFlagsOverrideSet + 1)
                          >> 0x38);
      title[8] = (char)(undefined4)uVar2;
      title._9_7_ = (undefined7)((ulong)uVar2 >> 8);
      bVar4 = window_class->DockingAllowUnclassed;
    }
    *(ulong *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 1) =
         CONCAT17(title[0x10],title._9_7_);
    *(undefined8 *)((long)&(node->WindowClass).TabItemFlagsOverrideSet + 1) = title._17_8_;
    *(undefined8 *)&node->WindowClass = title._0_8_;
    (node->WindowClass).ViewportFlagsOverrideSet = (int)CONCAT71(title._9_7_,title[8]);
    (node->WindowClass).ViewportFlagsOverrideClear = SUB74(title._9_7_,3);
    (node->WindowClass).DockingAllowUnclassed = bVar4;
    iVar9 = ctx->FrameCount;
    IVar7 = id;
    if (((uVar8 & 1) == 0) && (node->LastFrameActive == iVar9)) {
      if ((node->MergedFlags & 0x400) != 0) {
        __assert_fail("node->IsDockSpace() == false && \"Cannot call DockSpace() twice a frame with the same ID\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x3c02,
                      "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                     );
      }
      uVar5 = node->LocalFlags | 0x400;
      node->LocalFlags = uVar5;
      node->MergedFlags = uVar8 | node->LocalFlagsInWindows | uVar5;
    }
    else {
      uVar5 = node->LocalFlags | 0x400;
      node->LocalFlags = uVar5;
      node->MergedFlags = uVar8 | node->LocalFlagsInWindows | uVar5;
      if ((uVar8 & 1) == 0) {
        IVar1 = GetContentRegionAvail();
        iVar9 = (int)(*size_arg).x;
        iVar10 = (int)(*size_arg).y;
        size.x = (float)iVar9;
        size.y = (float)iVar10;
        if ((iVar9 < 1) && (size.x = IVar1.x + size.x, size.x <= 4.0)) {
          size.x = 4.0;
        }
        if ((iVar10 < 1) && (size.y = IVar1.y + size.y, size.y <= 4.0)) {
          size.y = 4.0;
        }
        if ((size.x <= 0.0) || (size.y <= 0.0)) {
          __assert_fail("size.x > 0.0f && size.y > 0.0f",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x3c15,
                        "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        node->Pos = (this->DC).CursorPos;
        node->SizeRef = size;
        node->Size = size;
        pIVar3 = GImGui;
        uVar8 = (GImGui->NextWindowData).Flags;
        (GImGui->NextWindowData).Flags = uVar8 | 1;
        (pIVar3->NextWindowData).PosVal = node->Pos;
        (pIVar3->NextWindowData).PosPivotVal.x = 0.0;
        (pIVar3->NextWindowData).PosPivotVal.y = 0.0;
        (pIVar3->NextWindowData).PosCond = 1;
        (pIVar3->NextWindowData).PosUndock = true;
        (pIVar3->NextWindowData).Flags = uVar8 | 3;
        (pIVar3->NextWindowData).SizeVal = node->Size;
        (pIVar3->NextWindowData).SizeCond = 1;
        (ctx->NextWindowData).PosUndock = false;
        ImFormatString(title,0x100,"%s/DockSpace_%08X",this->Name,id);
        PushStyleVar(8,0.0);
        Begin(title,(bool *)0x0,0x210001bb);
        PopStyleVar(1);
        host_window = ctx->CurrentWindow;
        DockNodeSetupHostWindow(node,host_window);
        IVar6 = ImGuiWindow::GetID(this,title,(char *)0x0);
        host_window->ChildId = IVar6;
        node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
        if (node->ParentNode != (ImGuiDockNode *)0x0) {
          __assert_fail("node->IsRootNode()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x3c30,
                        "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        if ((node->ChildNodes[0] == (ImGuiDockNode *)0x0) && ((node->MergedFlags & 0x800) == 0)) {
          uVar8 = node->LocalFlags | 0x800;
          node->LocalFlags = uVar8;
          node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar8;
        }
        DockNodeUpdate(node);
        End();
        ItemSize(&size,-1.0);
      }
      else {
        node->LastFrameAlive = iVar9;
      }
    }
  }
  return IVar7;
}

Assistant:

ImGuiID ImGui::DockSpace(ImGuiID id, const ImVec2& size_arg, ImGuiDockNodeFlags flags, const ImGuiWindowClass* window_class)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    ImGuiWindow* window = GetCurrentWindow();
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return 0;

    // Early out if parent window is hidden/collapsed
    // This is faster but also DockNodeUpdateTabBar() relies on TabBarLayout() running (which won't if SkipItems=true) to set NextSelectedTabId = 0). See #2960.
    // If for whichever reason this is causing problem we would need to ensure that DockNodeUpdateTabBar() ends up clearing NextSelectedTabId even if SkipItems=true.
    if (window->SkipItems)
        flags |= ImGuiDockNodeFlags_KeepAliveOnly;

    IM_ASSERT((flags & ImGuiDockNodeFlags_DockSpace) == 0);
    IM_ASSERT(id != 0);
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (!node)
    {
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X created\n", id);
        node = DockContextAddNode(ctx, id);
        node->SetLocalFlags(ImGuiDockNodeFlags_CentralNode);
    }
    if (window_class && window_class->ClassId != node->WindowClass.ClassId)
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X: setup WindowClass 0x%08X -> 0x%08X\n", id, node->WindowClass.ClassId, window_class->ClassId);
    node->SharedFlags = flags;
    node->WindowClass = window_class ? *window_class : ImGuiWindowClass();

    // When a DockSpace transitioned form implicit to explicit this may be called a second time
    // It is possible that the node has already been claimed by a docked window which appeared before the DockSpace() node, so we overwrite IsDockSpace again.
    if (node->LastFrameActive == g.FrameCount && !(flags & ImGuiDockNodeFlags_KeepAliveOnly))
    {
        IM_ASSERT(node->IsDockSpace() == false && "Cannot call DockSpace() twice a frame with the same ID");
        node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_DockSpace);
        return id;
    }
    node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_DockSpace);

    // Keep alive mode, this is allow windows docked into this node so stay docked even if they are not visible
    if (flags & ImGuiDockNodeFlags_KeepAliveOnly)
    {
        node->LastFrameAlive = g.FrameCount;
        return id;
    }

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);

    node->Pos = window->DC.CursorPos;
    node->Size = node->SizeRef = size;
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false;

    // FIXME-DOCK: Why do we need a child window to host a dockspace, could we host it in the existing window?
    // FIXME-DOCK: What is the reason for not simply calling BeginChild()? (OK to have a reason but should be commented)
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_DockNodeHost;
    window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoTitleBar;
    window_flags |= ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;
    window_flags |= ImGuiWindowFlags_NoBackground;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s/DockSpace_%08X", window->Name, id);

    PushStyleVar(ImGuiStyleVar_ChildBorderSize, 0.0f);
    Begin(title, NULL, window_flags);
    PopStyleVar();

    ImGuiWindow* host_window = g.CurrentWindow;
    DockNodeSetupHostWindow(node, host_window);
    host_window->ChildId = window->GetID(title);
    node->OnlyNodeWithWindows = NULL;

    IM_ASSERT(node->IsRootNode());

    // We need to handle the rare case were a central node is missing.
    // This can happen if the node was first created manually with DockBuilderAddNode() but _without_ the ImGuiDockNodeFlags_Dockspace.
    // Doing it correctly would set the _CentralNode flags, which would then propagate according to subsequent split.
    // It would also be ambiguous to attempt to assign a central node while there are split nodes, so we wait until there's a single node remaining.
    // The specific sub-property of _CentralNode we are interested in recovering here is the "Don't delete when empty" property,
    // as it doesn't make sense for an empty dockspace to not have this property.
    if (node->IsLeafNode() && !node->IsCentralNode())
        node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_CentralNode);

    // Update the node
    DockNodeUpdate(node);

    End();
    ItemSize(size);
    return id;
}